

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd_test.c
# Opt level: O0

void test_sfd_listen(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_url *u;
  nng_listener l;
  nng_socket s1;
  
  nVar1 = nng_pair1_open((nng_socket *)((long)&u + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x3a,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listen(u._4_4_,"socket://",(nng_listener *)&u,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x3b,"%s: expected success, got %s (%d)",
                         "nng_listen(s1, \"socket://\", &l, 0)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_get_url(u._0_4_,(nng_url **)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x3c,"%s: expected success, got %s (%d)","nng_listener_get_url(l, &u)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  pcVar3 = nng_url_scheme(_result__1);
  iVar2 = strcmp(pcVar3,"socket");
  pcVar3 = nng_url_scheme(_result__1);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x3d,"%s == %s",pcVar3,"socket",nVar1);
  pcVar3 = nng_url_path(_result__1);
  iVar2 = strcmp(pcVar3,"");
  pcVar3 = nng_url_path(_result__1);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x3e,"%s == %s",pcVar3,"");
  pcVar3 = nng_url_userinfo(_result__1);
  pcVar4 = nng_url_userinfo(_result__1);
  acutest_check_((uint)(pcVar3 == (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x3f,"%p == NULL",pcVar4);
  pcVar3 = nng_url_hostname(_result__1);
  pcVar4 = nng_url_hostname(_result__1);
  acutest_check_((uint)(pcVar3 == (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x40,"%p == NULL",pcVar4);
  pcVar3 = nng_url_query(_result__1);
  pcVar4 = nng_url_query(_result__1);
  acutest_check_((uint)(pcVar3 == (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x41,"%p == NULL",pcVar4);
  pcVar3 = nng_url_fragment(_result__1);
  pcVar4 = nng_url_fragment(_result__1);
  acutest_check_((uint)(pcVar3 == (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x42,"%p == NULL",pcVar4);
  nVar1 = nng_socket_close(u._4_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x44,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

void
test_sfd_listen(void)
{
	nng_socket     s1;
	nng_listener   l;
	const nng_url *u;

	NUTS_OPEN(s1);
	NUTS_PASS(nng_listen(s1, "socket://", &l, 0));
	NUTS_PASS(nng_listener_get_url(l, &u));
	NUTS_MATCH(nng_url_scheme(u), "socket");
	NUTS_MATCH(nng_url_path(u), "");
	NUTS_NULL(nng_url_userinfo(u));
	NUTS_NULL(nng_url_hostname(u));
	NUTS_NULL(nng_url_query(u));
	NUTS_NULL(nng_url_fragment(u));

	NUTS_CLOSE(s1);
}